

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O3

void __thiscall wasm::RemoveNonJSOpsPass::visitUnary(RemoveNonJSOpsPass *this,Unary *curr)

{
  UnaryOp UVar1;
  Builder *this_00;
  Name target;
  size_t *psVar2;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_68;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_60;
  __node_gen_type __node_gen;
  pointer local_50;
  size_t local_48;
  char *pcStack_40;
  allocator_type local_31;
  
  UVar1 = curr->op;
  switch(UVar1) {
  case CtzInt32:
    psVar2 = &WASM_CTZ32;
    break;
  case CtzInt64:
    psVar2 = &WASM_CTZ64;
    break;
  case PopcntInt32:
    psVar2 = &WASM_POPCNT32;
    break;
  case PopcntInt64:
    psVar2 = &WASM_POPCNT64;
    break;
  default:
    if (UVar1 == NearestFloat64) {
      psVar2 = &WASM_NEAREST_F64;
    }
    else {
      if (UVar1 != NearestFloat32) {
        return;
      }
      psVar2 = &WASM_NEAREST_F32;
    }
  }
  local_48 = *psVar2;
  pcStack_40 = (char *)psVar2[1];
  local_60 = &this->neededIntrinsics;
  std::
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
            ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_60,&local_48);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  target.super_IString.str._M_str = pcStack_40;
  target.super_IString.str._M_len = local_48;
  local_68 = curr->value;
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffa0,__l,&local_31);
  expression = Builder::makeCall(this_00,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &stack0xffffffffffffffa0,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).
                                       super_Expression.type.id,false);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)expression);
  if (local_60 !=
      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
       *)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    Name functionCall;
    switch (curr->op) {
      case NearestFloat32:
        functionCall = WASM_NEAREST_F32;
        break;
      case NearestFloat64:
        functionCall = WASM_NEAREST_F64;
        break;

      case PopcntInt64:
        functionCall = WASM_POPCNT64;
        break;
      case PopcntInt32:
        functionCall = WASM_POPCNT32;
        break;

      case CtzInt64:
        functionCall = WASM_CTZ64;
        break;
      case CtzInt32:
        functionCall = WASM_CTZ32;
        break;

      default:
        return;
    }
    neededIntrinsics.insert(functionCall);
    replaceCurrent(builder->makeCall(functionCall, {curr->value}, curr->type));
  }